

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_> * __thiscall
cmGeneratorTarget::GetSourceFilesWithoutObjectLibraries
          (vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_> *__return_storage_ptr__,
          cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  byte bVar2;
  KindedSources *this_00;
  size_type __n;
  string local_80;
  reference local_60;
  SourceAndKind *si;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
  *__range1;
  KindedSources *kinded;
  string *config_local;
  cmGeneratorTarget *this_local;
  vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_> *files;
  
  std::vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>::vector
            (__return_storage_ptr__);
  this_00 = GetKindedSources(this,config);
  __n = std::
        vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
        ::size(&this_00->Sources);
  std::vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>::reserve
            (__return_storage_ptr__,__n);
  __end1 = std::
           vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
           ::begin(&this_00->Sources);
  si = (SourceAndKind *)
       std::
       vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>::
       end(&this_00->Sources);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_cmGeneratorTarget::SourceAndKind_*,_std::vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>_>
                                     *)&si), bVar1) {
    local_60 = __gnu_cxx::
               __normal_iterator<const_cmGeneratorTarget::SourceAndKind_*,_std::vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>_>
               ::operator*(&__end1);
    cmSourceFile::GetObjectLibrary_abi_cxx11_(&local_80,(local_60->Source).Value);
    bVar2 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_80);
    if ((bVar2 & 1) != 0) {
      std::vector<BT<cmSourceFile_*>,_std::allocator<BT<cmSourceFile_*>_>_>::push_back
                (__return_storage_ptr__,&local_60->Source);
    }
    __gnu_cxx::
    __normal_iterator<const_cmGeneratorTarget::SourceAndKind_*,_std::vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<cmSourceFile*>>
cmGeneratorTarget::GetSourceFilesWithoutObjectLibraries(
  std::string const& config) const
{
  std::vector<BT<cmSourceFile*>> files;
  KindedSources const& kinded = this->GetKindedSources(config);
  files.reserve(kinded.Sources.size());
  for (SourceAndKind const& si : kinded.Sources) {
    if (si.Source.Value->GetObjectLibrary().empty()) {
      files.push_back(si.Source);
    }
  }
  return files;
}